

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_makefilename(_glist *x,char *file,char *result,int resultsize)

{
  char *__src;
  _canvasenvironment *p_Var1;
  size_t sVar2;
  uint uVar3;
  
  p_Var1 = canvas_getenv(x);
  __src = p_Var1->ce_dir->s_name;
  if (((*file == '\0') || ((*file != '/' && (file[1] != ':')))) && (*__src != '\0')) {
    strncpy(result,__src,(long)resultsize);
    result[(long)resultsize - 1] = '\0';
    sVar2 = strlen(result);
    uVar3 = ~(uint)sVar2 + resultsize;
    if ((int)uVar3 < 1) {
      return;
    }
    sVar2 = strlen(result);
    (result + sVar2)[0] = '/';
    (result + sVar2)[1] = '\0';
    strncat(result,file,(ulong)uVar3);
  }
  else {
    strncpy(result,file,(long)resultsize);
  }
  result[(long)resultsize + -1] = '\0';
  return;
}

Assistant:

void canvas_makefilename(const t_canvas *x, const char *file, char *result, int resultsize)
{
    const char *dir = canvas_getenv(x)->ce_dir->s_name;
    if (file[0] == '/' || (file[0] && file[1] == ':') || !*dir)
    {
        strncpy(result, file, resultsize);
        result[resultsize-1] = 0;
    }
    else
    {
        int nleft;
        strncpy(result, dir, resultsize);
        result[resultsize-1] = 0;
        nleft = resultsize - (int)strlen(result) - 1;
        if (nleft <= 0) return;
        strcat(result, "/");
        strncat(result, file, nleft);
        result[resultsize-1] = 0;
    }
}